

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_column_blob(sqlite3_stmt *pStmt,int i)

{
  void *pvVar1;
  int in_ESI;
  sqlite3_value *in_RDI;
  void *val;
  undefined4 in_stack_fffffffffffffff0;
  
  columnMem((sqlite3_stmt *)in_RDI,in_ESI);
  pvVar1 = sqlite3_value_blob(in_RDI);
  columnMallocFailure((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return pvVar1;
}

Assistant:

SQLITE_API const void *sqlite3_column_blob(sqlite3_stmt *pStmt, int i){
  const void *val;
  val = sqlite3_value_blob( columnMem(pStmt,i) );
  /* Even though there is no encoding conversion, value_blob() might
  ** need to call malloc() to expand the result of a zeroblob()
  ** expression.
  */
  columnMallocFailure(pStmt);
  return val;
}